

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O1

bdConnection * __thiscall
bdConnectManager::findExistingConnectionBySender
          (bdConnectManager *this,bdId *sender,bdId *src,bdId *dest)

{
  uint uVar1;
  iterator iVar2;
  bdConnection *pbVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bdNodeId proxyId;
  uchar local_78 [16];
  key_type local_68;
  
  uVar1 = determinePosition(this,(bdNodeId *)sender,&src->id,&dest->id);
  if ((uVar1 | 2) == 3) {
    local_78._0_4_ = *(undefined4 *)((sender->id).data + 0x10);
    uVar4 = *(undefined4 *)(sender->id).data;
    uVar5 = *(undefined4 *)((sender->id).data + 4);
    uVar6 = *(undefined4 *)((sender->id).data + 8);
    uVar7 = *(undefined4 *)((sender->id).data + 0xc);
  }
  else {
    local_78._0_4_ = *(undefined4 *)((this->mOwnId).data + 0x10);
    uVar4 = *(undefined4 *)(this->mOwnId).data;
    uVar5 = *(undefined4 *)((this->mOwnId).data + 4);
    uVar6 = *(undefined4 *)((this->mOwnId).data + 8);
    uVar7 = *(undefined4 *)((this->mOwnId).data + 0xc);
  }
  local_68.srcId.data._16_4_ = *(undefined4 *)((src->id).data + 0x10);
  local_68.srcId.data._0_8_ = *(undefined8 *)(src->id).data;
  local_68.srcId.data._8_8_ = *(undefined8 *)((src->id).data + 8);
  local_68.proxyId.data._4_4_ = uVar5;
  local_68.proxyId.data._0_4_ = uVar4;
  local_68.proxyId.data._12_4_ = uVar7;
  local_68.proxyId.data._8_4_ = uVar6;
  local_68.proxyId.data[0x10] = local_78[0];
  local_68.proxyId.data[0x11] = local_78[1];
  local_68.proxyId.data[0x12] = local_78[2];
  local_68.proxyId.data[0x13] = local_78[3];
  local_68.destId.data._0_8_ = *(undefined8 *)(dest->id).data;
  local_68.destId.data._8_8_ = *(undefined8 *)((dest->id).data + 8);
  local_68.destId.data._16_4_ = *(undefined4 *)((dest->id).data + 0x10);
  iVar2 = std::
          _Rb_tree<bdProxyTuple,_std::pair<const_bdProxyTuple,_bdConnection>,_std::_Select1st<std::pair<const_bdProxyTuple,_bdConnection>_>,_std::less<bdProxyTuple>,_std::allocator<std::pair<const_bdProxyTuple,_bdConnection>_>_>
          ::find(&(this->mConnections)._M_t,&local_68);
  pbVar3 = (bdConnection *)0x0;
  if ((_Rb_tree_header *)iVar2._M_node != &(this->mConnections)._M_t._M_impl.super__Rb_tree_header)
  {
    pbVar3 = (bdConnection *)(iVar2._M_node + 3);
  }
  return pbVar3;
}

Assistant:

bdConnection *bdConnectManager::findExistingConnectionBySender(bdId *sender, bdId *src, bdId *dest) {
	bdNodeId proxyId;
	bdNodeId *senderId = &(sender->id);
	bdNodeId *srcId = &(src->id);
	bdNodeId *destId = &(dest->id);
	determineProxyId(senderId, srcId, destId, &proxyId);

	return findExistingConnection(srcId, &proxyId, destId);
}